

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prolog.cpp
# Opt level: O2

void __thiscall Goal::solve(Goal *this,Program *prog,int level,VarMapping *vars)

{
  Trace *whereto;
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  Compound *l;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_00;
  char *dst;
  Program *iter;
  Program *pPVar3;
  Clause *this_00;
  
  indent(level);
  poVar2 = std::operator<<((ostream *)&std::cout,"solve@");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,level);
  std::operator<<(poVar2,": ");
  print(this);
  dst = "\n";
  std::operator<<((ostream *)&std::cout,"\n");
  src = extraout_RDX;
  for (pPVar3 = prog; whereto = Trace::history, pPVar3 != (Program *)0x0; pPVar3 = pPVar3->tail) {
    iVar1 = Clause::copy(pPVar3->head,(EVP_PKEY_CTX *)dst,src);
    this_00 = (Clause *)CONCAT44(extraout_var,iVar1);
    Trace::Undo(whereto);
    indent(level);
    std::operator<<((ostream *)&std::cout,"  try:");
    Clause::print(this_00);
    std::operator<<((ostream *)&std::cout,"\n");
    dst = (char *)this_00->head;
    iVar1 = (*(this->head->super_Term)._vptr_Term[1])();
    if ((char)iVar1 == '\0') {
      indent(level);
      dst = "  nomatch.\n";
      std::operator<<((ostream *)&std::cout,"  nomatch.\n");
    }
    else {
      l = (Compound *)this->tail;
      if (this_00->body != (Goal *)0x0) {
        dst = (char *)l;
        l = (Compound *)append(this_00->body,(Goal *)l);
      }
      if (l == (Compound *)0x0) {
        VarMapping::show_answer(vars);
      }
      else {
        dst = (char *)prog;
        solve((Goal *)l,prog,level + 1,vars);
      }
    }
    Trace::Undo(whereto);
    src = extraout_RDX_00;
  }
  return;
}

Assistant:

void Goal::solve(Program *prog, int level, VarMapping *vars)
{
    indent(level);
    std::cout << "solve@" << level << ": ";
    this->print();
    std::cout << "\n";

    //
    // Iterate over the clauses of the program.
    //
    for (Program *iter = prog; iter; iter = iter->tail) {
        Trace *tr = Trace::Note();
        Clause *cl = iter->head->copy();
        Trace::Undo(tr);

        indent(level);
        std::cout << "  try:";
        cl->print();
        std::cout << "\n";

        // Match the goal to the clause head.
        if (head->unify(cl->head)) {

            // Matched: extend the goal with the clause body and solve it,
            // with the level incremented.
            Goal *gdash = cl->body ? cl->body->append(tail) : tail;
            if (gdash)
                gdash->solve(prog, level + 1, vars);
            else
                vars->show_answer();
        } else {
            indent(level);
            std::cout << "  nomatch.\n";
        }

        // Reset the variables bound at this iteration.
        Trace::Undo(tr);
    }
}